

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

SigHashType __thiscall cfd::core::Psbt::GetTxInSighashType(Psbt *this,uint32_t index)

{
  long lVar1;
  CfdException *this_00;
  uint in_EDX;
  undefined4 extraout_EDX;
  SigHashType *sighash_type;
  undefined4 in_register_00000034;
  long *plVar2;
  SigHashType SVar3;
  undefined1 local_48 [32];
  
  plVar2 = (long *)CONCAT44(in_register_00000034,index);
  (**(code **)(*plVar2 + 0x10))(plVar2,in_EDX,0xacb,"GetTxInSighashType");
  lVar1 = plVar2[1];
  if (*(int *)(*(long *)(lVar1 + 0x10) + 0x90 + (ulong)in_EDX * 0x110) != 0) {
    SigHashType::SigHashType((SigHashType *)this);
    SigHashType::SetFromSigHashFlag
              ((SigHashType *)this,
               *(uint8_t *)(*(long *)(lVar1 + 0x10) + 0x90 + (ulong)in_EDX * 0x110));
    SVar3.is_anyone_can_pay_ = (bool)(char)extraout_EDX;
    SVar3.is_fork_id_ = (bool)(char)((uint)extraout_EDX >> 8);
    SVar3._10_2_ = (short)((uint)extraout_EDX >> 0x10);
    SVar3._0_8_ = this;
    return SVar3;
  }
  local_48._0_8_ = "cfdcore_psbt.cpp";
  local_48._8_4_ = 0xad5;
  local_48._16_8_ = "GetTxInSighashType";
  logger::log<>((CfdSourceLocation *)local_48,kCfdLogLevelWarning,"sighash not found.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"psbt sighash not found error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SigHashType Psbt::GetTxInSighashType(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (psbt_pointer->inputs[index].sighash != 0) {
    SigHashType sighash_type;
    sighash_type.SetFromSigHashFlag(
        static_cast<uint8_t>(psbt_pointer->inputs[index].sighash));
    return sighash_type;
  } else {
    warn(CFD_LOG_SOURCE, "sighash not found.");
    throw CfdException(kCfdIllegalStateError, "psbt sighash not found error.");
  }
}